

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O0

void __thiscall nuraft::timer_helper::reset(timer_helper *this)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = (mutex_type *)std::chrono::_V2::system_clock::now();
  in_RDI->_M_device = pmVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b5205);
  return;
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> l(lock_);
        t_created_ = std::chrono::system_clock::now();
    }